

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O1

int evutil_socket_connect_(int *fd_ptr,sockaddr *sa,int socklen)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  int iVar5;
  
  bVar1 = false;
  if (*fd_ptr < 0) {
    bVar2 = false;
    iVar3 = socket((uint)sa->sa_family,1,0);
    *fd_ptr = iVar3;
    if (iVar3 < 0) goto LAB_00254f9c;
    iVar3 = evutil_make_socket_nonblocking(iVar3);
    bVar2 = true;
    bVar1 = true;
    if (iVar3 < 0) goto LAB_00254f9c;
  }
  bVar2 = bVar1;
  iVar3 = connect(*fd_ptr,(sockaddr *)sa,socklen);
  if (-1 < iVar3) {
    return 1;
  }
  piVar4 = __errno_location();
  iVar3 = *piVar4;
  iVar5 = 0;
  if (iVar3 == 4) {
LAB_00254f66:
    bVar1 = false;
  }
  else {
    bVar1 = false;
    if (iVar3 != 0x73) {
      if (iVar3 == 0x6f) {
        iVar5 = 2;
        goto LAB_00254f66;
      }
      bVar1 = true;
      iVar5 = 0;
    }
  }
  if (!bVar1) {
    return iVar5;
  }
LAB_00254f9c:
  if (bVar2) {
    close(*fd_ptr);
    *fd_ptr = -1;
  }
  return -1;
}

Assistant:

int
evutil_socket_connect_(evutil_socket_t *fd_ptr, const struct sockaddr *sa, int socklen)
{
	int made_fd = 0;

	if (*fd_ptr < 0) {
		if ((*fd_ptr = socket(sa->sa_family, SOCK_STREAM, 0)) < 0)
			goto err;
		made_fd = 1;
		if (evutil_make_socket_nonblocking(*fd_ptr) < 0) {
			goto err;
		}
	}

	if (connect(*fd_ptr, sa, socklen) < 0) {
		int e = evutil_socket_geterror(*fd_ptr);
		if (EVUTIL_ERR_CONNECT_RETRIABLE(e))
			return 0;
		if (EVUTIL_ERR_CONNECT_REFUSED(e))
			return 2;
		goto err;
	} else {
		return 1;
	}

err:
	if (made_fd) {
		evutil_closesocket(*fd_ptr);
		*fd_ptr = -1;
	}
	return -1;
}